

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

void read_numeral(LexState *ls,SemInfo *seminfo)

{
  size_t sVar1;
  byte *pbVar2;
  int iVar3;
  ushort **ppuVar4;
  bool bVar5;
  uint local_24;
  uint local_1c;
  SemInfo *seminfo_local;
  LexState *ls_local;
  
  do {
    save(ls,ls->current);
    sVar1 = ls->z->n;
    ls->z->n = sVar1 - 1;
    if (sVar1 == 0) {
      local_1c = luaZ_fill(ls->z);
    }
    else {
      pbVar2 = (byte *)ls->z->p;
      ls->z->p = (char *)(pbVar2 + 1);
      local_1c = (uint)*pbVar2;
    }
    ls->current = local_1c;
    ppuVar4 = __ctype_b_loc();
    bVar5 = true;
    if (((*ppuVar4)[ls->current] & 0x800) == 0) {
      bVar5 = ls->current == 0x2e;
    }
  } while (bVar5);
  iVar3 = check_next(ls,"Ee");
  if (iVar3 != 0) {
    check_next(ls,"+-");
  }
  while( true ) {
    ppuVar4 = __ctype_b_loc();
    bVar5 = true;
    if (((*ppuVar4)[ls->current] & 8) == 0) {
      bVar5 = ls->current == 0x5f;
    }
    if (!bVar5) break;
    save(ls,ls->current);
    sVar1 = ls->z->n;
    ls->z->n = sVar1 - 1;
    if (sVar1 == 0) {
      local_24 = luaZ_fill(ls->z);
    }
    else {
      pbVar2 = (byte *)ls->z->p;
      ls->z->p = (char *)(pbVar2 + 1);
      local_24 = (uint)*pbVar2;
    }
    ls->current = local_24;
  }
  save(ls,0);
  buffreplace(ls,'.',ls->decpoint);
  iVar3 = luaO_str2d(ls->buff->buffer,&seminfo->r);
  if (iVar3 == 0) {
    luaX_lexerror(ls,"malformed number",0x11c);
  }
  return;
}

Assistant:

static void read_numeral(LexState*ls,SemInfo*seminfo){
do{
save_and_next(ls);
}while(isdigit(ls->current)||ls->current=='.');
if(check_next(ls,"Ee"))
check_next(ls,"+-");
while(isalnum(ls->current)||ls->current=='_')
save_and_next(ls);
save(ls,'\0');
buffreplace(ls,'.',ls->decpoint);
if(!luaO_str2d(luaZ_buffer(ls->buff),&seminfo->r))
luaX_lexerror(ls,"malformed number",TK_NUMBER);
}